

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * Cudd_addBddThreshold(DdManager *dd,DdNode *f,double value)

{
  DdNode *val_00;
  DdNode *val;
  DdNode *res;
  double value_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  val_00 = cuddUniqueConst(dd,value);
  if (val_00 == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)val_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)val_00 & 0xfffffffffffffffe) + 4) + 1;
    do {
      dd->reordered = 0;
      dd_local = (DdManager *)addBddDoThreshold(dd,f,val_00);
    } while (dd->reordered == 1);
    if (dd_local == (DdManager *)0x0) {
      Cudd_RecursiveDeref(dd,val_00);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,val_00);
      *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addBddThreshold(
  DdManager * dd,
  DdNode * f,
  CUDD_VALUE_TYPE  value)
{
    DdNode *res;
    DdNode *val;
    
    val = cuddUniqueConst(dd,value);
    if (val == NULL) return(NULL);
    cuddRef(val);

    do {
        dd->reordered = 0;
        res = addBddDoThreshold(dd, f, val);
    } while (dd->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(dd, val);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, val);
    cuddDeref(res);
    return(res);

}